

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv_udp_getsockname(uv_udp_t *handle,sockaddr *name,int *namelen)

{
  int iVar1;
  int *piVar2;
  socklen_t local_2c;
  socklen_t *psStack_28;
  socklen_t socklen;
  int *namelen_local;
  sockaddr *name_local;
  uv_udp_t *handle_local;
  
  if ((handle->io_watcher).fd == -1) {
    handle_local._4_4_ = -0x16;
  }
  else {
    local_2c = *namelen;
    psStack_28 = (socklen_t *)namelen;
    namelen_local = (int *)name;
    name_local = (sockaddr *)handle;
    iVar1 = getsockname((handle->io_watcher).fd,(sockaddr *)name,&local_2c);
    if (iVar1 == 0) {
      *psStack_28 = local_2c;
      handle_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      handle_local._4_4_ = -*piVar2;
    }
  }
  return handle_local._4_4_;
}

Assistant:

int uv_udp_getsockname(const uv_udp_t* handle,
                       struct sockaddr* name,
                       int* namelen) {
  socklen_t socklen;

  if (handle->io_watcher.fd == -1)
    return UV_EINVAL;  /* FIXME(bnoordhuis) UV_EBADF */

  /* sizeof(socklen_t) != sizeof(int) on some systems. */
  socklen = (socklen_t) *namelen;

  if (getsockname(handle->io_watcher.fd, name, &socklen))
    return UV__ERR(errno);

  *namelen = (int) socklen;
  return 0;
}